

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

void __thiscall
VectorWriter::VectorWriter<CBlockHeaderAndShortTxIDs_const&>
          (VectorWriter *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchDataIn,
          size_t nPosIn,CBlockHeaderAndShortTxIDs *args)

{
  long in_FS_OFFSET;
  Wrapper<VectorFormatter<CustomUintFormatter<6,_false>_>,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->vchData = vchDataIn;
  this->nPos = nPosIn;
  if ((ulong)((long)(vchDataIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(vchDataIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) < nPosIn) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(vchDataIn,nPosIn);
  }
  local_20.m_object = &args->shorttxids;
  SerializeMany<VectorWriter,CBlockHeader,unsigned_long,Wrapper<VectorFormatter<CustomUintFormatter<6,false>>,std::vector<unsigned_long,std::allocator<unsigned_long>>const&>,std::vector<PrefilledTransaction,std::allocator<PrefilledTransaction>>>
            (this,&args->header,&args->nonce,&local_20,&args->prefilledtxn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VectorWriter(std::vector<unsigned char>& vchDataIn, size_t nPosIn, Args&&... args) : VectorWriter{vchDataIn, nPosIn}
    {
        ::SerializeMany(*this, std::forward<Args>(args)...);
    }